

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.cc
# Opt level: O1

void __thiscall Pl_AES_PDF::initializeVector(Pl_AES_PDF *this)

{
  uchar uVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  if (this->use_zero_iv == true) {
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0;
  }
  else {
    if (this->use_specified_iv != true) {
      if (use_static_iv) {
        uVar1 = '\x0e';
        lVar2 = 0;
        do {
          this->cbc_block[lVar2] = uVar1;
          lVar2 = lVar2 + 1;
          uVar1 = uVar1 + '\x0e';
        } while (lVar2 != 0x10);
        return;
      }
      QUtil::initializeWithRandomBytes(this->cbc_block,0x10);
      return;
    }
    uVar3 = *(undefined4 *)this->specified_iv;
    uVar4 = *(undefined4 *)(this->specified_iv + 4);
    uVar5 = *(undefined4 *)(this->specified_iv + 8);
    uVar6 = *(undefined4 *)(this->specified_iv + 0xc);
  }
  *(undefined4 *)this->cbc_block = uVar3;
  *(undefined4 *)(this->cbc_block + 4) = uVar4;
  *(undefined4 *)(this->cbc_block + 8) = uVar5;
  *(undefined4 *)(this->cbc_block + 0xc) = uVar6;
  return;
}

Assistant:

void
Pl_AES_PDF::initializeVector()
{
    if (use_zero_iv) {
        for (unsigned int i = 0; i < this->buf_size; ++i) {
            this->cbc_block[i] = 0;
        }
    } else if (use_specified_iv) {
        std::memcpy(this->cbc_block, this->specified_iv, this->buf_size);
    } else if (use_static_iv) {
        for (unsigned int i = 0; i < this->buf_size; ++i) {
            this->cbc_block[i] = static_cast<unsigned char>(14U * (1U + i));
        }
    } else {
        QUtil::initializeWithRandomBytes(this->cbc_block, this->buf_size);
    }
}